

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myexpand.c
# Opt level: O0

void read_file(FILE *file,int tabstop)

{
  char cVar1;
  int iVar2;
  int local_1c;
  int p;
  int writePos;
  char readChar;
  int tabstop_local;
  FILE *file_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = fgetc((FILE *)file);
    cVar1 = (char)iVar2;
    if (cVar1 == -1) break;
    if (cVar1 == '\t') {
      iVar2 = local_1c / tabstop;
      for (; local_1c < tabstop * (iVar2 + 1); local_1c = local_1c + 1) {
        fprintf(_stdout,"%c",0x20);
      }
    }
    else {
      local_1c = local_1c + 1;
      fprintf(_stdout,"%c",(ulong)(uint)(int)cVar1);
      if (cVar1 == '\n') {
        local_1c = 0;
      }
    }
  }
  iVar2 = feof((FILE *)file);
  if (iVar2 != 0) {
    return;
  }
  fprintf(_stderr,"%s ERROR:\t",name);
  fprintf(_stderr,"couldn\'t read file to end");
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

static void read_file(FILE *file, int tabstop)
{
	char readChar;
	int writePos = 0;
	while ((readChar = fgetc(file)) != EOF)
	{
		if (readChar == '\t')
		{
			int p = tabstop * ((writePos / tabstop) + 1);
			for (; writePos < p; writePos++)
			{
				fprintf(stdout, "%c", ' ');
			}
			continue;
		}

		writePos++;
		fprintf(stdout, "%c", readChar);
		if (readChar == '\n')
		{
			writePos = 0;
		}
	}
	if (!feof(file))
	{
		ERROR_EXIT("couldn't read file to end");
	}
}